

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMesh2.c
# Opt level: O1

void Bmc_MeshTest2(Gia_Man_t *p,int X,int Y,int T,int fVerbose)

{
  Vec_Int_t *pVVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  sat_solver *s;
  Gia_Obj_t *pGVar6;
  abctime aVar7;
  uint uVar8;
  undefined4 in_register_0000000c;
  uint uVar9;
  undefined4 in_register_00000014;
  long lVar10;
  abctime time;
  int iVar11;
  ulong uVar12;
  undefined4 in_register_00000034;
  lit *begin;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  char *pcVar18;
  timespec *ptVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  int Lit;
  int iGVars [4];
  int iTVars [4];
  int pLits [100];
  int pN [102] [2];
  int Me [102] [102];
  undefined8 uVar29;
  undefined4 uVar30;
  timespec *local_a910;
  int local_a8fc;
  ulong local_a8f8;
  ulong local_a8f0;
  ulong local_a8e8;
  ulong local_a8e0;
  ulong local_a8d8;
  ulong local_a8d0;
  ulong local_a8c8;
  ulong local_a8c0;
  ulong local_a8b8;
  ulong local_a8b0;
  ulong local_a8a8;
  ulong local_a8a0;
  int local_a894;
  ulong local_a890;
  ulong local_a888;
  long local_a880;
  ulong local_a878;
  ulong local_a870;
  ulong local_a868;
  ulong local_a860;
  ulong local_a858;
  uint local_a850;
  int local_a84c;
  int local_a848;
  int local_a844;
  int local_a840;
  int local_a83c;
  int local_a838 [4];
  int local_a828 [6];
  ulong local_a810;
  ulong local_a808;
  ulong local_a800;
  ulong local_a7f8;
  ulong local_a7f0;
  ulong local_a7e8;
  ulong local_a7e0;
  ulong local_a7d8;
  ulong local_a7d0;
  ulong local_a7c8;
  lit *local_a7c0;
  ulong local_a7b8;
  long local_a7b0;
  long local_a7a8;
  long local_a7a0;
  long local_a798;
  ulong local_a790;
  timespec local_a788;
  lit local_a778 [13];
  lit local_a744 [81];
  int aiStack_a600 [205];
  int iStack_a2cc;
  timespec local_a2c8 [25];
  int local_a12c;
  int local_40;
  int local_3c;
  
  local_a8e0 = CONCAT44(in_register_00000034,X);
  local_a8e8 = CONCAT44(in_register_00000014,Y);
  local_a894 = fVerbose;
  iVar3 = clock_gettime(3,local_a2c8);
  if (iVar3 < 0) {
    local_a880 = -1;
  }
  else {
    local_a880 = local_a2c8[0].tv_nsec / 1000 + local_a2c8[0].tv_sec * 1000000;
  }
  s = sat_solver_new();
  memset(local_a2c8,0,0xa290);
  memset(aiStack_a600 + 2,0,0x330);
  if ((((int)local_a8e0 < 0x65) && ((int)local_a8e8 < 0x65)) && (T < 0x65)) {
    pVVar1 = p->vCis;
    uVar25 = pVVar1->nSize;
    local_a8f8 = (ulong)uVar25;
    uVar8 = p->nRegs;
    local_a8c8 = (ulong)(uint)p->nObjs;
    uVar23 = uVar25 - uVar8;
    uVar9 = p->vCos->nSize;
    local_a890 = (ulong)uVar9;
    uVar9 = ~(uVar9 + uVar25);
    local_a8f0 = (ulong)uVar9;
    iVar3 = p->nObjs + uVar23 + uVar9;
    if (iVar3 < 0x65) {
      if (0 < (int)uVar23) {
        memset(aiStack_a600 + 2,0xff,(ulong)(~uVar8 + uVar25) * 8 + 8);
      }
      if ((0 < (int)local_a8c8) && (pGVar6 = p->pObjs, pGVar6 != (Gia_Obj_t *)0x0)) {
        lVar10 = -1;
        do {
          uVar29 = *(undefined8 *)pGVar6;
          uVar25 = (uint)uVar29;
          if ((~uVar25 & 0x1fffffff) != 0 && -1 < (int)uVar25) {
            aiStack_a600[lVar10 * 2 + 2] = (int)lVar10 - (uVar25 & 0x1fffffff);
            aiStack_a600[lVar10 * 2 + 3] =
                 (int)lVar10 - ((uint)((ulong)uVar29 >> 0x20) & 0x1fffffff);
          }
          pGVar6 = pGVar6 + 1;
          lVar22 = lVar10 - local_a8c8;
          lVar10 = lVar10 + 1;
        } while (lVar22 != -2);
      }
      local_a808 = (long)(int)uVar23;
      local_a878 = (ulong)uVar23;
      if (local_a894 != 0) {
        printf("The graph has %d inputs: ",(ulong)(pVVar1->nSize - uVar8));
        if (0 < (int)uVar23) {
          iVar11 = uVar8 - (int)local_a8f8;
          uVar27 = 0x61;
          do {
            printf("%c ",uVar27);
            iVar20 = (int)uVar27;
            uVar27 = (ulong)(iVar20 + 1);
          } while (iVar11 + iVar20 != 0x60);
        }
        printf("  and %d nodes: ",(ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
        uVar27 = local_a808;
        iVar11 = (int)local_a878;
        if (iVar11 < iVar3) {
          iVar20 = (int)local_a8f0;
          iVar24 = (int)local_a8c8;
          lVar10 = 0;
          do {
            printf("%c=%c%c ",(ulong)(uint)(iVar11 + 0x61 + (int)lVar10),
                   (ulong)(aiStack_a600[uVar27 * 2 + lVar10 * 2 + 2] + 0x61),
                   (ulong)(aiStack_a600[uVar27 * 2 + lVar10 * 2 + 3] + 0x61));
            lVar10 = lVar10 + 1;
          } while (iVar20 + iVar24 != (int)lVar10);
        }
        putchar(10);
      }
      iVar11 = (int)local_a8e0;
      if ((int)local_a8e8 < 1) {
        uVar27 = 0;
      }
      else {
        uVar15 = 0;
        ptVar19 = local_a2c8;
        uVar27 = 0;
        do {
          if (0 < iVar11) {
            lVar10 = 0;
            do {
              *(int *)((long)&ptVar19->tv_sec + lVar10) = (int)uVar27;
              lVar10 = lVar10 + 0x198;
              uVar27 = (ulong)((int)uVar27 +
                              (((int)local_a8c8 + T) - ((int)local_a890 + uVar8)) + 0x10);
            } while ((local_a8e0 & 0xffffffff) * 0x198 - lVar10 != 0);
          }
          uVar15 = uVar15 + 1;
          ptVar19 = (timespec *)((long)&ptVar19->tv_sec + 4);
        } while (uVar15 != (local_a8e8 & 0xffffffff));
      }
      local_a860 = (ulong)uVar8;
      local_40 = T;
      local_3c = iVar3;
      if (local_a894 != 0) {
        iVar20 = (int)local_a8e8 * iVar11;
        printf("SAT variable count is %d (%d time vars + %d graph vars + %d config vars + %d aux vars)\n"
               ,uVar27,(ulong)(uint)(iVar20 * T),(ulong)(uint)(iVar3 * iVar20),
               (ulong)(uint)(iVar20 * 0x10));
      }
      if (0 < iVar11) {
        local_a8b8 = (ulong)((int)local_a8e0 - 1);
        local_a8c0 = (ulong)((int)local_a8e8 - 1);
        local_a8d0 = local_a8e0 & 0xffffffff;
        local_a8a0 = local_a8e8 & 0xffffffff;
        local_a8f0 = (ulong)(uint)((int)local_a8f0 + (int)local_a8c8);
        local_a8a8 = CONCAT44(local_a8a8._4_4_,(T + (int)local_a8f8) - (int)local_a860);
        uVar27 = 0;
        do {
          uVar15 = uVar27;
          if (0 < (int)local_a8e8) {
            uVar12 = 0;
            local_a8b0 = uVar27;
            do {
              iVar11 = *(int *)((long)local_a2c8 + uVar12 * 4 + uVar27 * 0x198);
              if ((local_a8b0 == 0) ||
                 (uVar12 == local_a8c0 || (uVar12 == 0 || local_a8b0 == local_a8b8))) {
                if (0 < T) {
                  iVar20 = iVar11 * 2;
                  iVar24 = 0;
                  do {
                    if (iVar11 < 0) goto LAB_005b32a4;
                    local_a8fc = (iVar20 + 1) - (uint)(iVar24 == 0);
                    iVar4 = sat_solver_addclause(s,&local_a8fc,(lit *)&local_a8f8);
                    if (iVar4 == 0) {
                      __assert_fail("RetValue",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                    ,0xac,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                    }
                    iVar24 = iVar24 + 1;
                    iVar20 = iVar20 + 2;
                  } while (T != iVar24);
                }
                if ((int)local_a878 < iVar3) {
                  iVar11 = iVar11 + (int)local_a8a8;
                  iVar20 = iVar11 * 2 + 1;
                  uVar15 = local_a8f0 & 0xffffffff;
                  do {
                    if (iVar11 < 0) goto LAB_005b32a4;
                    local_a8fc = iVar20;
                    iVar24 = sat_solver_addclause(s,&local_a8fc,(lit *)&local_a8f8);
                    if (iVar24 == 0) {
                      __assert_fail("RetValue",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                    ,0xb2,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                    }
                    iVar20 = iVar20 + 2;
                    iVar11 = iVar11 + 1;
                    uVar25 = (int)uVar15 - 1;
                    uVar15 = (ulong)uVar25;
                  } while (uVar25 != 0);
                }
              }
              else {
                if (iVar11 < 0) goto LAB_005b32a4;
                local_a8fc = iVar11 * 2 + 1;
                iVar11 = sat_solver_addclause(s,&local_a8fc,(lit *)&local_a8f8);
                if (iVar11 == 0) {
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                ,0xb8,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                }
              }
              uVar12 = uVar12 + 1;
              uVar15 = local_a8b0;
            } while (uVar12 != local_a8a0);
          }
          uVar27 = uVar15 + 1;
        } while (uVar27 != local_a8d0);
      }
      local_a850 = (int)local_a8e0 - 1;
      uVar8 = (int)local_a8e8 - 1;
      local_a868 = (ulong)uVar8;
      uVar25 = (int)local_a890 + (int)local_a860;
      local_a890 = (ulong)uVar25;
      local_a858 = (ulong)~uVar25;
      local_a848 = 1;
      if (1 < T) {
        local_a848 = T;
      }
      uVar9 = 1;
      if (1 < (int)uVar8) {
        uVar9 = uVar8;
      }
      uVar27 = local_a8d8 >> 0x20;
      local_a8d8 = uVar27 << 0x20;
      local_a7f8 = 1;
      if (1 < (int)local_a850) {
        local_a7f8 = (ulong)local_a850;
      }
      if (SBORROW4(local_a850,2) == (int)local_a8e0 + -3 < 0) {
        local_a7b8 = (ulong)(T + iVar3 + 0x10);
        local_a7c0 = (lit *)((long)&local_a788.tv_sec + (long)T * 4);
        iVar11 = (int)local_a8c8;
        local_a840 = ~uVar25 + iVar11;
        local_a84c = (int)local_a8f8 * 0xc + (int)local_a860 * -0xc;
        local_a7d0 = (ulong)uVar9;
        local_a844 = (uVar25 - iVar11) + 1;
        local_a7a8 = (ulong)(uint)T * 2;
        local_a7d8 = (ulong)(uint)(iVar11 + T);
        iVar11 = (iVar11 + T) - uVar25;
        local_a7c8 = (ulong)(iVar11 - 1);
        local_a7f0 = (ulong)(uVar25 * -2 + 7);
        local_a7e8 = (ulong)~(uVar25 * 2);
        local_a7e0 = (ulong)(iVar11 + 3);
        local_a7a0 = (long)iVar3;
        local_a8d8 = uVar27 << 0x20;
        uVar27 = 1;
        do {
          local_a810 = uVar27 + 1;
          if (1 < (int)local_a868) {
            uVar15 = 1;
            local_a7b0 = (long)local_a2c8 + (uVar27 - 1) * 0x198;
            local_a800 = uVar27;
            do {
              uVar25 = *(uint *)((long)local_a2c8 + uVar15 * 4 + uVar27 * 0x198);
              local_a888 = (ulong)uVar25;
              uVar8 = uVar25 + T;
              local_a8d0 = (ulong)uVar8;
              iVar11 = (int)local_a7b8 + uVar25;
              local_a828[0] = *(int *)(local_a7b0 + uVar15 * 4);
              local_a838[0] = local_a828[0] + T;
              local_a828[1] = (&iStack_a2cc)[uVar27 * 0x66 + uVar15];
              local_a838[1] = (&iStack_a2cc)[uVar27 * 0x66 + uVar15] + T;
              local_a828[2] = *(int *)((long)local_a2c8 + uVar15 * 4 + local_a810 * 0x198);
              local_a838[2] = local_a828[2] + T;
              local_a828[3] = *(int *)((long)local_a2c8 + uVar15 * 4 + uVar27 * 0x198 + 4);
              local_a838[3] = local_a828[3] + T;
              local_a870 = uVar15;
              if (0 < iVar3) {
                iVar24 = uVar8 * 2 + 1;
                iVar20 = 0;
                do {
                  if (((int)uVar8 < 0) || (local_a788.tv_sec._0_4_ = iVar24, iVar11 < 0))
                  goto LAB_005b32a4;
                  local_a788.tv_sec._4_4_ = iVar11 * 2;
                  iVar4 = sat_solver_addclause(s,(lit *)&local_a788,(lit *)&local_a788.tv_nsec);
                  if (iVar4 == 0) {
                    pcVar18 = "RetValue";
                    pcVar14 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                    ;
                    pcVar16 = "void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)";
                    goto LAB_005b3759;
                  }
                  iVar20 = iVar20 + -1;
                  iVar24 = iVar24 + 2;
                  uVar8 = uVar8 + 1;
                } while (local_a844 != iVar20);
                local_a8d8 = CONCAT44(local_a8d8._4_4_,(int)local_a8d8 - iVar20);
              }
              uVar12 = local_a870;
              if (iVar11 < 0) goto LAB_005b32a4;
              iVar11 = iVar11 * 2 + 1;
              local_a788.tv_sec._0_4_ = iVar11;
              if (1 < T) {
                lVar10 = 2;
                do {
                  if ((int)local_a888 + 1 < 0) goto LAB_005b32a4;
                  *(int *)((long)&local_a788.tv_sec + lVar10 * 2) =
                       (int)local_a888 * 2 + (int)lVar10;
                  lVar10 = lVar10 + 2;
                } while (local_a7a8 != lVar10);
              }
              iVar20 = sat_solver_addclause(s,(lit *)&local_a788,local_a7c0);
              if (iVar20 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                              ,0xe2,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
              }
              uVar25 = iVar3 + (int)local_a8d0;
              local_a8b0 = (ulong)uVar25;
              iVar24 = (int)local_a7c8 + (int)local_a888;
              iVar20 = iVar24 * 2;
              lVar10 = 0;
              do {
                local_a788.tv_sec._0_4_ = iVar11;
                if ((int)(uVar25 + (int)lVar10) < 0) goto LAB_005b32a4;
                local_a778[lVar10 + -3] = iVar20;
                lVar10 = lVar10 + 1;
                iVar20 = iVar20 + 2;
              } while (lVar10 != 0x10);
              iVar11 = sat_solver_addclause(s,(lit *)&local_a788,local_a744);
              if (iVar11 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                              ,0xe9,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
              }
              local_a8d8 = CONCAT44(local_a8d8._4_4_,(int)local_a8d8 + 2);
              uVar15 = uVar12 + 1;
              if (1 < T) {
                local_a798 = (long)(int)local_a8d0;
                iVar11 = (int)local_a7d8 + (int)local_a888;
                local_a83c = (int)local_a7e8 + iVar11 * 2;
                local_a8f8 = CONCAT44(local_a8f8._4_4_,(int)local_a7f0 + iVar11 * 2);
                local_a8a0 = CONCAT44(local_a8a0._4_4_,(int)local_a7e0 + (int)local_a888);
                local_a8a8 = (ulong)iVar24;
                iVar11 = 1;
                local_a870 = uVar12 + 1;
                do {
                  if (0 < iVar3) {
                    if (iVar11 + (int)local_a888 < 0) goto LAB_005b32a4;
                    iVar20 = (iVar11 + (int)local_a888) * 2 + 1;
                    iVar24 = 0;
                    do {
                      iVar28 = iVar24 + (int)local_a8d0;
                      iVar4 = iVar28 * 2 + 1;
                      local_a8d8 = CONCAT44(local_a8d8._4_4_,(int)local_a8d8 + 8);
                      lVar10 = 0;
                      iVar26 = local_a83c;
                      do {
                        local_a788.tv_sec._0_4_ = iVar20;
                        if ((iVar28 < 0) ||
                           (local_a788.tv_sec._4_4_ = iVar4, (int)local_a8b0 + (int)lVar10 < 0))
                        goto LAB_005b32a4;
                        local_a788.tv_nsec._0_4_ = iVar26;
                        iVar5 = local_a828[lVar10] + iVar11;
                        if (iVar5 == 0 || SCARRY4(local_a828[lVar10],iVar11) != iVar5 < 0)
                        goto LAB_005b32a4;
                        local_a788.tv_nsec._4_4_ = iVar5 * 2 + -2;
                        iVar5 = sat_solver_addclause(s,(lit *)&local_a788,local_a778);
                        if (iVar5 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                        ,0xf9,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)")
                          ;
                        }
                        local_a788.tv_sec._0_4_ = iVar20;
                        local_a788.tv_sec._4_4_ = iVar4;
                        local_a788.tv_nsec._0_4_ = iVar26;
                        if (local_a838[lVar10] + iVar24 < 0) goto LAB_005b32a4;
                        local_a788.tv_nsec._4_4_ = (local_a838[lVar10] + iVar24) * 2;
                        iVar5 = sat_solver_addclause(s,(lit *)&local_a788,local_a778);
                        if (iVar5 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                        ,0x100,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)"
                                       );
                        }
                        lVar10 = lVar10 + 1;
                        iVar26 = iVar26 + 2;
                      } while (lVar10 != 4);
                      iVar24 = iVar24 + 1;
                    } while (iVar24 != local_a840);
                  }
                  iVar20 = (int)local_a878;
                  if (0 < iVar20) {
                    local_a8d8 = CONCAT44(local_a8d8._4_4_,(int)local_a8d8 + local_a84c);
                    iVar24 = 0;
                    do {
                      iVar4 = iVar24 + (int)local_a8d0;
                      if (iVar4 < 0) goto LAB_005b32a4;
                      iVar4 = iVar4 * 2 + 1;
                      iVar28 = 0;
                      iVar26 = (int)local_a8f8;
                      do {
                        local_a788.tv_sec._0_4_ = iVar4;
                        if ((int)local_a8a0 + iVar28 < 0) goto LAB_005b32a4;
                        local_a788.tv_sec._4_4_ = iVar26;
                        iVar5 = sat_solver_addclause
                                          (s,(lit *)&local_a788,(lit *)&local_a788.tv_nsec);
                        if (iVar5 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                        ,0x109,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)"
                                       );
                        }
                        iVar28 = iVar28 + 1;
                        iVar26 = iVar26 + 2;
                      } while (iVar28 != 0xc);
                      iVar24 = iVar24 + 1;
                    } while (iVar24 != iVar20);
                  }
                  if (iVar20 < iVar3) {
                    uVar25 = (int)local_a888 + iVar11;
                    local_a790 = (ulong)uVar25;
                    iVar20 = uVar25 * 2 + 1;
                    uVar27 = local_a808;
                    do {
                      local_a8b8 = (ulong)aiStack_a600[uVar27 * 2 + 2];
                      if (((long)local_a8b8 < 0) ||
                         (local_a8c0 = (ulong)aiStack_a600[uVar27 * 2 + 3], (long)local_a8c0 < 0)) {
                        __assert_fail("pN[g][0] >= 0 && pN[g][1] >= 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                      ,0x110,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                      }
                      if (((long)uVar27 <= (long)local_a8b8) || ((long)uVar27 <= (long)local_a8c0))
                      {
                        __assert_fail("pN[g][0] < g && pN[g][1] < g",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                      ,0x111,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
                      }
                      if ((int)local_a790 < 0) goto LAB_005b32a4;
                      local_a8f0 = local_a798 + uVar27;
                      iVar4 = (int)local_a8f0 * 2 + 1;
                      local_a8d8 = CONCAT44(local_a8d8._4_4_,(int)local_a8d8 + 0x30);
                      lVar10 = 0;
                      iVar24 = (int)local_a8f8;
                      local_a860 = uVar27;
                      do {
                        local_a788.tv_sec._0_4_ = iVar20;
                        if (((long)local_a8f0 < 0) ||
                           (local_a788.tv_sec._4_4_ = iVar4, (long)(local_a8a8 + lVar10) < -4))
                        goto LAB_005b32a4;
                        local_a788.tv_nsec._0_4_ = iVar24;
                        iVar26 = (&DAT_00a00340)[lVar10 * 2];
                        iVar28 = local_a828[iVar26] + iVar11;
                        if (iVar28 == 0 || SCARRY4(local_a828[iVar26],iVar11) != iVar28 < 0)
                        goto LAB_005b32a4;
                        local_a788.tv_nsec._4_4_ = iVar28 * 2 + -2;
                        iVar28 = sat_solver_addclause(s,(lit *)&local_a788,local_a778);
                        if (iVar28 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                        ,0x118,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)"
                                       );
                        }
                        local_a788.tv_sec._0_4_ = iVar20;
                        local_a788.tv_sec._4_4_ = iVar4;
                        local_a788.tv_nsec._0_4_ = iVar24;
                        iVar28 = (&DAT_00a00344)[lVar10 * 2];
                        iVar5 = local_a828[iVar28] + iVar11;
                        if (iVar5 == 0 || SCARRY4(local_a828[iVar28],iVar11) != iVar5 < 0)
                        goto LAB_005b32a4;
                        local_a788.tv_nsec._4_4_ = iVar5 * 2 + -2;
                        iVar5 = sat_solver_addclause(s,(lit *)&local_a788,local_a778);
                        if (iVar5 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                        ,0x11f,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)"
                                       );
                        }
                        local_a788.tv_sec._0_4_ = iVar20;
                        local_a788.tv_sec._4_4_ = iVar4;
                        local_a788.tv_nsec._0_4_ = iVar24;
                        if (local_a838[iVar26] + (int)local_a8b8 < 0) goto LAB_005b32a4;
                        local_a788.tv_nsec._4_4_ = (local_a838[iVar26] + (int)local_a8b8) * 2;
                        iVar26 = sat_solver_addclause(s,(lit *)&local_a788,local_a778);
                        if (iVar26 == 0) {
                          __assert_fail("RetValue",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                                        ,0x127,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)"
                                       );
                        }
                        local_a788.tv_sec._0_4_ = iVar20;
                        local_a788.tv_sec._4_4_ = iVar4;
                        local_a788.tv_nsec._0_4_ = iVar24;
                        if (local_a838[iVar28] + (int)local_a8c0 < 0) goto LAB_005b32a4;
                        local_a788.tv_nsec._4_4_ = (local_a838[iVar28] + (int)local_a8c0) * 2;
                        iVar26 = sat_solver_addclause(s,(lit *)&local_a788,local_a778);
                        if (iVar26 == 0) {
                          pcVar18 = "RetValue";
                          pcVar14 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                          ;
                          pcVar16 = "void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)";
                          goto LAB_005b32b9;
                        }
                        lVar10 = lVar10 + 1;
                        iVar24 = iVar24 + 2;
                      } while (lVar10 != 0xc);
                      uVar27 = local_a860 + 1;
                    } while ((long)uVar27 < local_a7a0);
                  }
                  iVar11 = iVar11 + 1;
                  uVar27 = local_a800;
                  uVar15 = local_a870;
                } while (iVar11 != local_a848);
              }
            } while (uVar15 != local_a7d0);
          }
          uVar27 = local_a810;
        } while (local_a810 != local_a7f8);
      }
      local_a12c = local_a12c + iVar3 + T;
      if (local_a12c < 1) {
LAB_005b32a4:
        pcVar18 = "Var >= 0 && !(c >> 1)";
        pcVar14 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
        ;
        pcVar16 = "int Abc_Var2Lit(int, int)";
LAB_005b32b9:
        __assert_fail(pcVar18,pcVar14,0x12e,pcVar16);
      }
      local_a8fc = local_a12c * 2 + -2;
      begin = &local_a8fc;
      iVar11 = sat_solver_addclause(s,begin,(lit *)&local_a8f8);
      if (iVar11 == 0) {
        printf("Problem has no solution. ");
        aVar7 = Abc_Clock();
        Abc_PrintTime((int)aVar7 - (int)local_a880,(char *)begin,time);
      }
      else {
        if (local_a894 != 0) {
          printf("Finished adding %d clauses. Started solving...\n");
        }
        local_a8a0 = (ulong)local_a850;
        local_a8c0 = local_a8e0 & 0xffffffff;
        local_a8b0 = local_a8e8 & 0xffffffff;
        local_a8f0 = (ulong)(uint)(iVar3 + T);
        while( true ) {
          uVar27 = local_a8f0;
          uVar29 = 0;
          iVar11 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
          uVar30 = (undefined4)((ulong)uVar29 >> 0x20);
          if (iVar11 != 1) break;
          local_a8a8 = CONCAT44(local_a8a8._4_4_,1);
          if ((int)local_a8e0 < 1) {
            iVar11 = 0;
          }
          else {
            uVar27 = 0;
            local_a910 = local_a2c8;
            iVar11 = 0;
            do {
              if (0 < (int)local_a8e8) {
                uVar15 = 0;
                local_a8b8 = uVar27;
                do {
                  if ((uVar27 == 0) ||
                     (local_a868 == uVar15 || (uVar15 == 0 || uVar27 == local_a8a0))) {
                    iVar20 = *(int *)((long)&local_a910->tv_sec + uVar15 * 4) + T;
                    iVar20 = Bmc_MeshAddOneHotness2(s,iVar20,iVar20 + iVar3);
                    iVar11 = iVar11 + iVar20;
                  }
                  else {
                    iVar20 = *(int *)((long)&local_a910->tv_sec + uVar15 * 4);
                    iVar4 = iVar20 + T;
                    iVar20 = Bmc_MeshAddOneHotness2(s,iVar20,iVar4);
                    iVar24 = Bmc_MeshAddOneHotness2(s,iVar4,iVar4 + iVar3);
                    uVar27 = local_a8b8;
                    iVar4 = Bmc_MeshAddOneHotness2(s,iVar4 + iVar3,iVar3 + iVar4 + 0x10);
                    iVar11 = iVar4 + iVar24 + iVar20 + iVar11;
                  }
                  uVar15 = uVar15 + 1;
                } while (local_a8b0 != uVar15);
              }
              uVar30 = (undefined4)((ulong)uVar29 >> 0x20);
              uVar27 = uVar27 + 1;
              local_a910 = (timespec *)&local_a910[0x19].tv_nsec;
            } while (uVar27 != local_a8c0);
          }
          if (iVar11 < 1) {
            pcVar16 = "Satisfying solution found. ";
            uVar27 = local_a8f0;
            iVar11 = (int)local_a8a8;
            goto LAB_005b3336;
          }
          printf("Adding %d one-hotness clauses.\n");
        }
        if (iVar11 == -1) {
          pcVar16 = "Problem has no solution. ";
        }
        else {
          pcVar16 = "Computation timed out. ";
          if (iVar11 != 0) {
            __assert_fail("status == l_True",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                          ,0x159,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
          }
        }
LAB_005b3336:
        printf(pcVar16);
        iVar24 = 3;
        iVar20 = clock_gettime(3,&local_a788);
        if (iVar20 < 0) {
          lVar10 = -1;
        }
        else {
          lVar10 = CONCAT44(local_a788.tv_nsec._4_4_,(int)local_a788.tv_nsec) / 1000 +
                   CONCAT44(local_a788.tv_sec._4_4_,(int)local_a788.tv_sec) * 1000000;
        }
        lVar10 = lVar10 - local_a880;
        iVar20 = 0;
        Abc_Print(iVar24,"%s =","Time");
        Abc_Print(iVar24,"%9.2f sec\n",(double)lVar10 / 1000000.0);
        uVar15 = local_a8e0;
        if (iVar11 == 1) {
          uVar12 = 0;
          uVar25 = (uint)local_a8e0;
          if (2 < (int)local_a8e8) {
            iVar11 = T + (int)local_a8c8;
            uVar12 = 0;
            uVar13 = 1;
            iVar20 = 0;
            do {
              if (2 < (int)uVar25) {
                uVar17 = 1;
                do {
                  iVar24 = *(int *)((long)local_a2c8 + uVar13 * 4 + uVar17 * 0x198);
                  uVar8 = iVar24 + (int)uVar27;
                  uVar21 = (ulong)uVar8;
                  lVar10 = 0;
                  do {
                    if (((int)uVar21 < 0) || (s->size <= (int)(uVar8 + (int)lVar10)))
                    goto LAB_005b3744;
                    iVar20 = iVar20 + (uint)(s->model[uVar21] == 1);
                    lVar10 = lVar10 + 1;
                    uVar21 = uVar21 + 1;
                  } while (lVar10 != 4);
                  lVar10 = (long)(iVar24 + (int)local_a858 + iVar11) + 4;
                  lVar22 = 0xc;
                  do {
                    if (((iVar11 - (int)local_a890) + 3 + iVar24 < 0) || (s->size <= lVar10))
                    goto LAB_005b3744;
                    uVar12 = (ulong)((int)uVar12 + (uint)(s->model[lVar10] == 1));
                    lVar10 = lVar10 + 1;
                    lVar22 = lVar22 + -1;
                  } while (lVar22 != 0);
                  uVar17 = uVar17 + 1;
                } while (uVar17 != local_a8a0);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != (local_a868 & 0xffffffff));
          }
          local_a8f8 = 0;
          printf("The %d x %d mesh with latency %d with %d active cells (%d nodes and %d buffers):\n"
                 ,local_a8e0 & 0xffffffff,local_a8e8,CONCAT44(in_register_0000000c,T),
                 (ulong)(uint)((int)uVar12 + iVar20),uVar12,CONCAT44(uVar30,iVar20));
          printf(" Y\\X ");
          if (0 < (int)uVar25) {
            uVar8 = 0;
            do {
              printf("  %-2d ",(ulong)uVar8);
              uVar8 = uVar8 + 1;
            } while (uVar25 != uVar8);
          }
          putchar(10);
          uVar8 = 0;
          if (0 < T) {
            uVar8 = T;
          }
          uVar9 = 0;
          if (0 < (int)uVar25) {
            uVar9 = uVar25;
          }
          if (0 < (int)local_a8e8) {
            local_a8f8 = local_a8e8;
          }
          local_a8f8 = local_a8f8 & 0xffffffff;
          if (0 < (int)local_a8e8) {
            local_a8d8 = local_a868 & 0xffffffff;
            local_a8a8 = (ulong)uVar9;
            local_a8c0 = (ulong)(uint)((int)local_a8c8 + (int)local_a858);
            uVar27 = 0;
            do {
              printf(" %-2d  ",uVar27 & 0xffffffff);
              if (0 < (int)uVar15) {
                uVar12 = 0;
                local_a8d0 = uVar27;
                do {
                  if (T < 1) {
LAB_005b36bf:
                    pcVar16 = "     ";
                    if ((uVar12 == local_a8a0 || uVar27 == 0) || uVar27 == local_a8d8) {
                      pcVar16 = "  *  ";
                    }
                    if (uVar12 == 0) {
                      pcVar16 = "  *  ";
                    }
                    printf(pcVar16);
                  }
                  else {
                    iVar11 = *(int *)((long)local_a2c8 + uVar27 * 4 + uVar12 * 0x198);
                    local_a8b0 = (ulong)iVar11;
                    local_a8b8 = (ulong)(iVar11 + T);
                    bVar2 = false;
                    uVar27 = 0;
                    local_a8f0 = uVar12;
                    do {
                      if (0 < iVar3) {
                        lVar10 = uVar27 + local_a8b0;
                        if (lVar10 < 0) {
LAB_005b3744:
                          pcVar18 = "v >= 0 && v < s->size";
                          pcVar14 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ;
                          pcVar16 = "int sat_solver_var_value(sat_solver *, int)";
LAB_005b3759:
                          __assert_fail(pcVar18,pcVar14,0xda,pcVar16);
                        }
                        uVar13 = 0x61;
                        uVar15 = local_a8b8;
                        uVar12 = local_a8c0;
                        do {
                          if (s->size <= lVar10) goto LAB_005b3744;
                          if (s->model[lVar10] == 1) {
                            if (((long)uVar15 < 0) || ((long)s->size <= (long)uVar15))
                            goto LAB_005b3744;
                            if (s->model[uVar15] == 1) {
                              printf(" %c%-2d ",uVar13,uVar27 & 0xffffffff);
                              bVar2 = true;
                            }
                          }
                          uVar13 = (ulong)((int)uVar13 + 1);
                          uVar15 = uVar15 + 1;
                          uVar12 = uVar12 - 1;
                        } while (uVar12 != 0);
                      }
                      uVar27 = uVar27 + 1;
                    } while (uVar27 != uVar8);
                    uVar12 = local_a8f0;
                    uVar15 = local_a8e0;
                    uVar27 = local_a8d0;
                    if (!bVar2) goto LAB_005b36bf;
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar12 != local_a8a8);
              }
              putchar(10);
              uVar27 = uVar27 + 1;
            } while (uVar27 != local_a8f8);
          }
        }
      }
      sat_solver_delete(s);
      return;
    }
  }
  __assert_fail("X <= 100 && Y <= 100 && T <= 100 && G <= 100",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMesh2.c"
                ,0x79,"void Bmc_MeshTest2(Gia_Man_t *, int, int, int, int)");
}

Assistant:

void Bmc_MeshTest2( Gia_Man_t * p, int X, int Y, int T, int fVerbose )
{
    abctime clk = Abc_Clock();
//    sat_solver * pSat = satoko_create();
    sat_solver * pSat = sat_solver_new();
    Gia_Obj_t * pObj;
    int Me[102][102] = {{0}};
    int pN[102][2] = {{0}};
    int I = Gia_ManPiNum(p);
    int G = I + Gia_ManAndNum(p);
    int i, x, y, t, g, c, status, RetValue, Lit, iVar, nClauses = 0;

    assert( X <= 100 && Y <= 100 && T <= 100 && G <= 100 );

    // init the graph
    for ( i = 0; i < I; i++ )
        pN[i][0] = pN[i][1] = -1;
    Gia_ManForEachAnd( p, pObj, i )
    {
        pN[i-1][0] = Gia_ObjFaninId0(pObj, i)-1;
        pN[i-1][1] = Gia_ObjFaninId1(pObj, i)-1;
    }
    if ( fVerbose )
    {
        printf( "The graph has %d inputs: ", Gia_ManPiNum(p) );
        for ( i = 0; i < I; i++ )
            printf( "%c ", 'a' + i );
        printf( "  and %d nodes: ", Gia_ManAndNum(p) );
        for ( i = I; i < G; i++ )
            printf( "%c=%c%c ", 'a' + i, 'a' + pN[i][0] , 'a' + pN[i][1] );
        printf( "\n" );
    }

    // init SAT variables (time vars + graph vars + config vars)
    // config variables: 16 = 4 buff vars + 12 node vars
    iVar = 0;
    for ( y = 0; y < Y; y++ )
    for ( x = 0; x < X; x++ )
    {
        //printf( "%3d %3d %3d    %s", iVar, iVar+T, iVar+T+G, x == X-1 ? "\n":"" );
        Me[x][y] = iVar;
        iVar += T + G + NCPARS + 1;
    }
    Me[101][100] = T;
    Me[101][101] = G;
    if ( fVerbose )
        printf( "SAT variable count is %d (%d time vars + %d graph vars + %d config vars + %d aux vars)\n", iVar, X*Y*T, X*Y*G, X*Y*NCPARS, X*Y );

    // add constraints

    // time 0 and primary inputs only on the boundary
    for ( x = 0; x < X; x++ )
    for ( y = 0; y < Y; y++ )
    {
        int iTVar = Bmc_MeshTVar( Me, x, y );
        int iGVar = Bmc_MeshGVar( Me, x, y );

        if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
        {
            // time 0 is required
            for ( t = 0; t < T; t++ )
            {
                Lit = Abc_Var2Lit( iTVar+t, (int)(t > 0) );
                RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  assert( RetValue );
            }
            // internal nodes are not allowed
            for ( g = I; g < G; g++ )
            {
                Lit = Abc_Var2Lit( iGVar+g, 1 );
                RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  assert( RetValue );
            }
        }
        else // not a boundary
        {
            Lit = Abc_Var2Lit( iTVar, 1 );  // cannot have time 0
            RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  assert( RetValue );
        }
    }
    for ( x = 1; x < X-1; x++ )
    for ( y = 1; y < Y-1; y++ )
    {
        int pLits[100], nLits;

        int iTVar = Bmc_MeshTVar( Me, x, y );
        int iGVar = Bmc_MeshGVar( Me, x, y );
        int iCVar = Bmc_MeshCVar( Me, x, y );
        int iUVar = Bmc_MeshUVar( Me, x, y );

        // 0=left  1=up  2=right  3=down
        int iTVars[4]; 
        int iGVars[4];

        iTVars[0] = Bmc_MeshTVar( Me, x-1, y );
        iGVars[0] = Bmc_MeshGVar( Me, x-1, y );

        iTVars[1] = Bmc_MeshTVar( Me, x, y-1 );
        iGVars[1] = Bmc_MeshGVar( Me, x, y-1 );

        iTVars[2] = Bmc_MeshTVar( Me, x+1, y );
        iGVars[2] = Bmc_MeshGVar( Me, x+1, y );

        iTVars[3] = Bmc_MeshTVar( Me, x, y+1 );
        iGVars[3] = Bmc_MeshGVar( Me, x, y+1 );

        // condition when cell is used
        for ( g = 0; g < G; g++ )
        {
            pLits[0] = Abc_Var2Lit( iGVar+g, 1 );
            pLits[1] = Abc_Var2Lit( iUVar, 0 );
            RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );  assert( RetValue );
            nClauses++;
        }

        // at least one time is used
        pLits[0] = Abc_Var2Lit( iUVar, 1 );
        for ( t = 1; t < T; t++ )
            pLits[t] = Abc_Var2Lit( iTVar+t, 0 );
        RetValue = sat_solver_addclause( pSat, pLits, pLits+T );  assert( RetValue );
        nClauses++;

        // at least one config is used
        pLits[0] = Abc_Var2Lit( iUVar, 1 );
        for ( c = 0; c < NCPARS; c++ )
            pLits[c+1] = Abc_Var2Lit( iCVar+c, 0 );
        RetValue = sat_solver_addclause( pSat, pLits, pLits+NCPARS+1 );  assert( RetValue );
        nClauses++;

        // constraints for each time
        for ( t = 1; t < T; t++ )
        {
            int Conf[12][2] = {{0, 1}, {0, 2}, {0, 3}, {1, 2}, {1, 3}, {2, 3},   {1, 0}, {2, 0}, {3, 0}, {2, 1}, {3, 1}, {3, 2}};
            // buffer
            for ( g = 0; g < G; g++ )
            for ( c = 0; c < 4; c++ )
            {
                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[c]+t-1, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[c]+g, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nClauses += 2;
            }
            for ( g = 0; g < I; g++ )
            for ( c = 4; c < NCPARS; c++ )
            {
                pLits[0] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[1] = Abc_Var2Lit( iCVar+c, 1 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+2 );  assert( RetValue );
                nClauses++;
            }
            // node
            for ( g = I; g < G; g++ )
            for ( c = 0; c < 12; c++ )
            {
                assert( pN[g][0] >= 0 && pN[g][1] >= 0 );
                assert( pN[g][0] <  g && pN[g][1] <  g );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[Conf[c][0]]+t-1, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iTVars[Conf[c][1]]+t-1, 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );


                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[Conf[c][0]]+pN[g][0], 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nLits = 0;
                pLits[ nLits++ ] = Abc_Var2Lit( iTVar+t, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVar+g, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iCVar+c+4, 1 );
                pLits[ nLits++ ] = Abc_Var2Lit( iGVars[Conf[c][1]]+pN[g][1], 0 );
                RetValue = sat_solver_addclause( pSat, pLits, pLits+nLits );  assert( RetValue );

                nClauses += 4;
            }
        }
    }

    // final condition
    {
        int iGVar = Bmc_MeshGVar( Me, 1, 1 ) + G-1;
        Lit = Abc_Var2Lit( iGVar, 0 );
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );  
        if ( RetValue == 0 )
        {
            printf( "Problem has no solution. " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//            satoko_destroy( pSat );
            sat_solver_delete( pSat );
            return;
        }
    }

    if ( fVerbose )
        printf( "Finished adding %d clauses. Started solving...\n", nClauses );

    while ( 1 )
    {
        int nAddClauses = 0;
//        status = satoko_solve( pSat );
        status = sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
//        if ( status == SATOKO_UNSAT )
        if ( status == l_False )
        {
            printf( "Problem has no solution. " );
            break;
        }
//        if ( status == SATOKO_UNDEC )
        if ( status == l_Undef )
        {
            printf( "Computation timed out. " );
            break;
        }
//        assert( status == SATOKO_SAT );
        assert( status == l_True );
        // check if the solution is valid and add constraints
        for ( x = 0; x < X; x++ )
        for ( y = 0; y < Y; y++ )
        {
            if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
            {
                int iGVar = Bmc_MeshGVar( Me, x, y );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iGVar, iGVar + G );
            }
            else
            {
                int iTVar = Bmc_MeshTVar( Me, x, y );
                int iGVar = Bmc_MeshGVar( Me, x, y );
                int iCVar = Bmc_MeshCVar( Me, x, y );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iTVar, iTVar + T );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iGVar, iGVar + G );
                nAddClauses += Bmc_MeshAddOneHotness2( pSat, iCVar, iCVar + NCPARS );
            }
        }
        if ( nAddClauses > 0 )
        {
            printf( "Adding %d one-hotness clauses.\n", nAddClauses );
            continue;
        }
        printf( "Satisfying solution found. " );
/*
//        iVar = satoko_varnum(pSat);
        iVar = sat_solver_nvars(pSat);
        for ( i = 0; i < iVar; i++ )
            if ( Bmc_MeshVarValue2(pSat, i) )
                printf( "%d ", i );
        printf( "\n" );
*/
        break;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    if ( status == SATOKO_SAT )
    if ( status == l_True )
    {
        // count the number of nodes and buffers
        int nBuffs = 0, nNodes = 0;
        for ( y = 1; y < Y-1; y++ )
        for ( x = 1; x < X-1; x++ )
        {
            int iCVar = Bmc_MeshCVar( Me, x, y );
            for ( c = 0; c < 4; c++ )
                if ( Bmc_MeshVarValue2(pSat, iCVar+c) )
                {
                    //printf( "Buffer y=%d x=%d  (var = %d; config = %d)\n", y, x, iCVar+c, c );
                    nBuffs++;
                }
            for ( c = 4; c < NCPARS; c++ )
                if ( Bmc_MeshVarValue2(pSat, iCVar+c) )
                {
                    //printf( "Node   y=%d x=%d  (var = %d; config = %d)\n", y, x, iCVar+c, c );
                    nNodes++;
                }
        }
        printf( "The %d x %d mesh with latency %d with %d active cells (%d nodes and %d buffers):\n", X, Y, T, nNodes+nBuffs, nNodes, nBuffs );
        // print mesh
        printf( " Y\\X " );
        for ( x = 0; x < X; x++ )
            printf( "  %-2d ", x );
        printf( "\n" );
        for ( y = 0; y < Y; y++ )
        {
            printf( " %-2d  ", y );
            for ( x = 0; x < X; x++ )
            {
                int iTVar  = Bmc_MeshTVar( Me, x, y );
                int iGVar  = Bmc_MeshGVar( Me, x, y );

                int fFound = 0;                ;
                for ( t = 0; t < T; t++ )
                for ( g = 0; g < G; g++ )
                    if ( Bmc_MeshVarValue2(pSat, iTVar+t) && Bmc_MeshVarValue2(pSat, iGVar+g) )
                    {
                        printf( " %c%-2d ", 'a' + g, t );
                        fFound = 1;
                    }
                if ( fFound )
                    continue;
                if ( x == 0 || x == X-1 || y == 0 || y == Y-1 ) // boundary
                    printf( "  *  " );
                else
                    printf( "     " );
            }
            printf( "\n" );
        }
    }
    //satoko_destroy( pSat );
    sat_solver_delete( pSat );
}